

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

TestInfo * __thiscall testing::TestSuite::GetTestInfo(TestSuite *this,int i)

{
  pointer piVar1;
  long lVar2;
  TestInfo *pTVar3;
  
  if ((-1 < i) &&
     (piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2))) {
    lVar2 = (long)piVar1[(uint)i];
    if (lVar2 < 0) {
      pTVar3 = (TestInfo *)0x0;
    }
    else {
      pTVar3 = (this->test_info_list_).
               super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl
               .super__Vector_impl_data._M_start[lVar2];
    }
    return pTVar3;
  }
  return (TestInfo *)0x0;
}

Assistant:

inline E GetElementOr(const std::vector<E>& v, int i, E default_value) {
  return (i < 0 || i >= static_cast<int>(v.size())) ? default_value
                                                    : v[static_cast<size_t>(i)];
}